

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Image.cc
# Opt level: O1

void __thiscall phosg::Image::reverse_horizontal(Image *this)

{
  long y;
  long lVar1;
  long x;
  uint64_t a2;
  uint64_t b2;
  uint64_t g2;
  uint64_t r2;
  uint64_t a1;
  uint64_t b1;
  uint64_t g1;
  uint64_t r1;
  uint64_t local_70;
  uint64_t local_68;
  uint64_t local_60;
  uint64_t local_58;
  uint64_t local_50;
  uint64_t local_48;
  uint64_t local_40;
  uint64_t local_38;
  
  if (0 < this->height) {
    y = 0;
    do {
      if (1 < this->width) {
        lVar1 = -1;
        x = 0;
        do {
          read_pixel(this,x,y,&local_38,&local_40,&local_48,&local_50);
          read_pixel(this,this->width + lVar1,y,&local_58,&local_60,&local_68,&local_70);
          write_pixel(this,this->width + lVar1,y,local_38,local_40,local_48,local_50);
          write_pixel(this,x,y,local_58,local_60,local_68,local_70);
          x = x + 1;
          lVar1 = lVar1 + -1;
        } while (x < this->width / 2);
      }
      y = y + 1;
    } while (y < this->height);
  }
  return;
}

Assistant:

void Image::reverse_horizontal() {
  for (ssize_t y = 0; y < this->height; y++) {
    for (ssize_t x = 0; x < this->width / 2; x++) {
      uint64_t r1, g1, b1, a1, r2, g2, b2, a2;
      this->read_pixel(x, y, &r1, &g1, &b1, &a1);
      this->read_pixel(this->width - x - 1, y, &r2, &g2, &b2, &a2);
      this->write_pixel(this->width - x - 1, y, r1, g1, b1, a1);
      this->write_pixel(x, y, r2, g2, b2, a2);
    }
  }
}